

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::SortedAggregateState::Absorb
          (SortedAggregateState *this,SortedAggregateBindData *order_bind,
          SortedAggregateState *other)

{
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var1;
  pointer pCVar2;
  type pCVar3;
  pointer pDVar4;
  type pDVar5;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  *this_00;
  
  if (other->count == 0) {
    return;
  }
  if (this->count != 0) {
    Resize(this,order_bind,this->count + other->count);
    if ((this->sort_chunk).
        super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
        super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl == (DataChunk *)0x0) {
      LinkedAbsorb(&other->sort_linked,&this->sort_linked);
      if ((this->arg_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
          super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->arg_linked).super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
          super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        LinkedAbsorb(&other->arg_linked,&this->arg_linked);
      }
    }
    else {
      if ((other->sort_chunk).
          super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
          super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl == (DataChunk *)0x0) {
        FlushLinkedLists(other,order_bind);
      }
      if ((this->ordering).
          super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
          .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
          (ColumnDataCollection *)0x0) {
        pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->(&this->sort_chunk);
        pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*(&other->sort_chunk);
        DataChunk::Append(pDVar4,pDVar5,false,(SelectionVector *)0x0,0);
        if ((this->arg_chunk).
            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
            super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
            super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl != (DataChunk *)0x0) {
          pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                   operator->(&this->arg_chunk);
          pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                   operator*(&other->arg_chunk);
          DataChunk::Append(pDVar4,pDVar5,false,(SelectionVector *)0x0,0);
        }
      }
      else {
        _Var1._M_head_impl =
             (other->ordering).
             super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
             .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
        pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->(&this->ordering);
        this_00 = &this->arguments;
        if (_Var1._M_head_impl == (ColumnDataCollection *)0x0) {
          pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                   operator*(&other->sort_chunk);
          ColumnDataCollection::Append(pCVar2,pDVar5);
          if ((this_00->
              super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
              .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
              (ColumnDataCollection *)0x0) {
            pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     ::operator->(this_00);
            pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                     operator*(&other->arg_chunk);
            ColumnDataCollection::Append(pCVar2,pDVar5);
          }
        }
        else {
          pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                   ::operator*(&other->ordering);
          ColumnDataCollection::Combine(pCVar2,pCVar3);
          if ((this_00->
              super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
              .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
              (ColumnDataCollection *)0x0) {
            pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     ::operator->(this_00);
            pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     ::operator*(&other->arguments);
            ColumnDataCollection::Combine(pCVar2,pCVar3);
          }
        }
      }
    }
    Reset(other);
    return;
  }
  Swap(this,other);
  return;
}

Assistant:

void Absorb(const SortedAggregateBindData &order_bind, SortedAggregateState &other) {
		if (!other.count) {
			return;
		} else if (!count) {
			Swap(other);
			return;
		}

		//	Change to a state large enough for all the data
		Resize(order_bind, count + other.count);

		//	3x3 matrix.
		//	We can simplify the logic a bit because the target is already set for the final capacity
		if (!sort_chunk) {
			//	If the combined count is still linked lists,
			//	then just move the pointers.
			//	Note that this assumes ArenaAllocator is shared and the memory will not vanish under us.
			LinkedAbsorb(other.sort_linked, sort_linked);
			if (!arg_linked.empty()) {
				LinkedAbsorb(other.arg_linked, arg_linked);
			}

			other.Reset();
			return;
		}

		if (!other.sort_chunk) {
			other.FlushLinkedLists(order_bind);
		}

		if (!ordering) {
			//	Still using chunks, which means the source is using chunks or lists
			D_ASSERT(sort_chunk);
			D_ASSERT(other.sort_chunk);
			sort_chunk->Append(*other.sort_chunk);
			if (arg_chunk) {
				D_ASSERT(other.arg_chunk);
				arg_chunk->Append(*other.arg_chunk);
			}
		} else {
			// Using collections, so source could be using anything.
			if (other.ordering) {
				ordering->Combine(*other.ordering);
				if (arguments) {
					D_ASSERT(other.arguments);
					arguments->Combine(*other.arguments);
				}
			} else {
				ordering->Append(*other.sort_chunk);
				if (arguments) {
					D_ASSERT(other.arg_chunk);
					arguments->Append(*other.arg_chunk);
				}
			}
		}

		//	Free all memory as we have absorbed it.
		other.Reset();
	}